

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ag::BitConverter::Get
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          agvariant *v)

{
  initializer_list<unsigned_char> __l;
  bool bVar1;
  int *piVar2;
  uchar *puVar3;
  uint *puVar4;
  float *pfVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  string local_60;
  allocator<unsigned_char> local_2a;
  uchar local_29;
  iterator local_28;
  size_type local_20;
  agvariant *local_18;
  agvariant *v_local;
  
  local_18 = v;
  v_local = (agvariant *)__return_storage_ptr__;
  bVar1 = std::holds_alternative<int,char,unsigned_int,int,float,std::__cxx11::string>(v);
  if (bVar1) {
    piVar2 = std::get<int,char,unsigned_int,int,float,std::__cxx11::string>(v);
    GetInt32(__return_storage_ptr__,*piVar2);
  }
  else {
    bVar1 = std::holds_alternative<char,char,unsigned_int,int,float,std::__cxx11::string>(v);
    if (bVar1) {
      puVar3 = (uchar *)std::get<char,char,unsigned_int,int,float,std::__cxx11::string>(v);
      local_29 = *puVar3;
      local_28 = &local_29;
      local_20 = 1;
      std::allocator<unsigned_char>::allocator(&local_2a);
      __l._M_len = local_20;
      __l._M_array = local_28;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (__return_storage_ptr__,__l,&local_2a);
      std::allocator<unsigned_char>::~allocator(&local_2a);
    }
    else {
      bVar1 = std::holds_alternative<unsigned_int,char,unsigned_int,int,float,std::__cxx11::string>
                        (v);
      if (bVar1) {
        puVar4 = std::get<unsigned_int,char,unsigned_int,int,float,std::__cxx11::string>(v);
        GetUInt32(__return_storage_ptr__,*puVar4);
      }
      else {
        bVar1 = std::holds_alternative<float,char,unsigned_int,int,float,std::__cxx11::string>(v);
        if (bVar1) {
          pfVar5 = std::get<float,char,unsigned_int,int,float,std::__cxx11::string>(v);
          GetFloat(__return_storage_ptr__,*pfVar5);
        }
        else {
          bVar1 = std::
                  holds_alternative<std::__cxx11::string,char,unsigned_int,int,float,std::__cxx11::string>
                            (v);
          if (bVar1) {
            pbVar6 = std::get<std::__cxx11::string,char,unsigned_int,int,float,std::__cxx11::string>
                               (v);
            std::__cxx11::string::string((string *)&local_60,(string *)pbVar6);
            GetString(__return_storage_ptr__,&local_60,true);
            std::__cxx11::string::~string((string *)&local_60);
          }
          else {
            memset(__return_storage_ptr__,0,0x18);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (__return_storage_ptr__);
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<uint8_t> Get(agvariant v)
		{
			if (std::holds_alternative<int>(v))
				return BitConverter::GetInt32(std::get<int>(v));
			else if (std::holds_alternative<char>(v))
				return { (uint8_t)std::get<char>(v) };
			else if (std::holds_alternative<unsigned int>(v))
				return BitConverter::GetUInt32(std::get<unsigned int>(v));
			else if (std::holds_alternative<float>(v))
				return BitConverter::GetFloat(std::get<float>(v));
			else if (std::holds_alternative<std::string>(v))
				return BitConverter::GetString(std::get<std::string>(v));
			return std::vector<uint8_t>();
		}